

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu.cxx
# Opt level: O0

Fl_Menu_Item * __thiscall Fl_Menu_Item::next(Fl_Menu_Item *this,int n)

{
  int iVar1;
  Fl_Menu_Item *local_28;
  Fl_Menu_Item *m;
  int n_local;
  Fl_Menu_Item *this_local;
  
  if (n < 0) {
    this_local = (Fl_Menu_Item *)0x0;
  }
  else {
    iVar1 = visible(this);
    local_28 = this;
    m._4_4_ = n;
    if (iVar1 == 0) {
      m._4_4_ = n + 1;
    }
    while (m._4_4_ != 0) {
      local_28 = next_visible_or_not(local_28);
      iVar1 = visible(local_28);
      if ((iVar1 != 0) || (local_28->text == (char *)0x0)) {
        m._4_4_ = m._4_4_ + -1;
      }
    }
    this_local = local_28;
  }
  return this_local;
}

Assistant:

const Fl_Menu_Item* Fl_Menu_Item::next(int n) const {
  if (n < 0) return 0; // this is so selected==-1 returns NULL
  const Fl_Menu_Item* m = this;
  if (!m->visible()) n++;
  while (n) {
    m = next_visible_or_not(m);
    if (m->visible() || !m->text) n--;
  }
  return m;
}